

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O2

ostream * __thiscall
dynamicgraph::SignalPtr<double,_int>::writeGraph(SignalPtr<double,_int> *this,ostream *os)

{
  int iVar1;
  SignalBase<int> *pSVar2;
  ostream *poVar3;
  string itNodeName;
  string itLocalName;
  string LeaderNodeName;
  string LeaderLocalName;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  SignalBase<int>::ExtractNodeAndLocalNames
            ((SignalBase<int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]),
             &local_30,&local_50);
  iVar1 = (*this->_vptr_SignalPtr[6])(this);
  if (((char)iVar1 != '\0') &&
     (this->signalPtr !=
      (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    local_70 = local_60;
    local_68 = 0;
    local_60[0] = 0;
    local_90 = local_80;
    local_88 = 0;
    local_80[0] = 0;
    pSVar2 = getAbstractPtr(this);
    (*pSVar2->_vptr_SignalBase[0x16])(pSVar2,&local_70,&local_90);
    poVar3 = std::operator<<(os,"\t\"");
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"\" -> \"");
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"\"");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"\t [ headlabel = \"");
    poVar3 = std::operator<<(poVar3,(string *)&local_30);
    poVar3 = std::operator<<(poVar3,"\" , taillabel = \"");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    poVar3 = std::operator<<(poVar3,"\", fontsize=7, fontcolor=red ]");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return os;
}

Assistant:

std::ostream &SignalPtr<T, Time>::writeGraph(std::ostream &os) const {
  std::string LeaderLocalName;
  std::string LeaderNodeName;
  Signal<T, Time>::ExtractNodeAndLocalNames(LeaderLocalName, LeaderNodeName);
  if (isAbstractPluged() && !autoref()) {
    std::string itLocalName, itNodeName;
    getAbstractPtr()->ExtractNodeAndLocalNames(itLocalName, itNodeName);
    os << "\t\"" << itNodeName << "\" -> \"" << LeaderNodeName << "\""
       << std::endl
       << "\t [ headlabel = \"" << LeaderLocalName << "\" , taillabel = \""
       << itLocalName << "\", fontsize=7, fontcolor=red ]" << std::endl;
  }
  return os;
}